

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O1

void __thiscall CppUnit::TestResult::endTest(TestResult *this,Test *test)

{
  SynchronizationObject *pSVar1;
  _Elt_pointer ppTVar2;
  _Elt_pointer ppTVar3;
  _Map_pointer pppTVar4;
  
  pSVar1 = (this->super_SynchronizedObject).m_syncObject;
  (*pSVar1->_vptr_SynchronizationObject[2])(pSVar1);
  ppTVar3 = (this->m_listeners).
            super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  if (ppTVar3 !=
      (this->m_listeners).
      super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur) {
    ppTVar2 = (this->m_listeners).
              super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    pppTVar4 = (this->m_listeners).
               super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppTVar3)->_vptr_TestListener[4])(*ppTVar3,test);
      ppTVar3 = ppTVar3 + 1;
      if (ppTVar3 == ppTVar2) {
        ppTVar3 = pppTVar4[1];
        pppTVar4 = pppTVar4 + 1;
        ppTVar2 = ppTVar3 + 0x40;
      }
    } while (ppTVar3 !=
             (this->m_listeners).
             super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  (*pSVar1->_vptr_SynchronizationObject[3])(pSVar1);
  return;
}

Assistant:

void 
TestResult::endTest( Test *test )
{ 
  ExclusiveZone zone( m_syncObject ); 
  for ( TestListeners::iterator it = m_listeners.begin();
        it != m_listeners.end(); 
        ++it )
    (*it)->endTest( test );
}